

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int valueFromExpr(sqlite3 *db,Expr *pExpr,u8 enc,u8 affinity,sqlite3_value **ppVal,
                 ValueNewStat4Ctx *pCtx)

{
  int *piVar1;
  ExprList *pEVar2;
  Parse *pParse;
  u8 uVar3;
  int iVar4;
  int iVar5;
  sqlite3_value *pRec;
  FuncDef *pFVar6;
  sqlite3_value **p;
  sqlite3_value *pRec_00;
  uchar *puVar7;
  MemValue MVar8;
  char *pcVar9;
  uint nArg;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  long lStack_b0;
  sqlite3_value *local_70;
  sqlite3_context local_68;
  
  local_70 = (Mem *)0x0;
  for (; (bVar13 = pExpr->op, bVar13 == 0xa6 || (bVar13 == 0xad)); pExpr = pExpr->pLeft) {
  }
  if (bVar13 == 0xa8) {
    bVar13 = pExpr->op2;
  }
  if (bVar13 == 0xa5) {
    pExpr = pExpr->pLeft;
    bVar13 = pExpr->op;
    if ((bVar13 | 2) != 0x93) {
      iVar5 = valueFromExpr(db,pExpr,enc,affinity,&local_70,pCtx);
      pRec = local_70;
      iVar4 = 0;
      if (local_70 != (Mem *)0x0 && iVar5 == 0) {
        sqlite3VdbeMemNumerify(local_70);
        if ((pRec->flags & 8) == 0) {
          (pRec->u).i = -(pRec->u).i;
        }
        else {
          (pRec->u).i = (pRec->u).i ^ 0x8000000000000000;
        }
        applyAffinity(pRec,affinity,enc);
      }
      goto LAB_00179eab;
    }
    pcVar9 = "-";
    lStack_b0 = -1;
  }
  else {
    if (bVar13 == 0x24) {
      uVar3 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
      iVar4 = valueFromExpr(db,pExpr->pLeft,enc,uVar3,ppVal,pCtx);
      if (*ppVal == (Mem *)0x0) {
        return iVar4;
      }
      sqlite3VdbeMemCast(*ppVal,uVar3,'\x01');
      applyAffinity(*ppVal,affinity,'\x01');
      return iVar4;
    }
    pcVar9 = "";
    lStack_b0 = 1;
  }
  if (bVar13 == 0x6e) {
LAB_001799c9:
    pRec = valueNew(db,pCtx);
    if (pRec != (sqlite3_value *)0x0) {
      if ((pExpr->flags & 0x400) == 0) {
        pcVar9 = sqlite3MPrintf(db,"%s%s",pcVar9,(pExpr->u).zToken);
        if (pcVar9 == (char *)0x0) goto LAB_00179d03;
        sqlite3VdbeMemSetStr(pRec,pcVar9,-1,'\x01',sqlite3MallocSize);
      }
      else {
        sqlite3VdbeMemSetInt64(pRec,lStack_b0 * (pExpr->u).iValue);
      }
      uVar3 = 'C';
      if (affinity != 'A' || (bVar13 & 0xfd) != 0x91) {
        uVar3 = affinity;
      }
      applyAffinity(pRec,uVar3,'\x01');
      if ((pRec->flags & 0xc) != 0) {
        pRec->flags = pRec->flags & 0xfffd;
      }
      iVar4 = 0;
      if (enc != '\x01') {
        iVar4 = sqlite3VdbeChangeEncoding(pRec,(uint)enc);
      }
      goto LAB_00179eab;
    }
  }
  else {
    if (bVar13 != 0x72) {
      if (bVar13 == 0x93) goto LAB_001799c9;
      if (bVar13 == 0x92) {
        pRec = valueNew(db,pCtx);
        iVar4 = 0;
        if (pRec != (sqlite3_value *)0x0) {
          pcVar9 = (pExpr->u).zToken;
          iVar5 = sqlite3Strlen30(pcVar9 + 2);
          pcVar9 = (char *)sqlite3HexToBlob(db,pcVar9 + 2,iVar5 + -1);
          sqlite3VdbeMemSetStr(pRec,pcVar9,(iVar5 + -1) / 2,'\0',sqlite3MallocSize);
          goto LAB_00179eab;
        }
        goto LAB_00179d00;
      }
      if (bVar13 == 0x91) goto LAB_001799c9;
      if ((pCtx == (ValueNewStat4Ctx *)0x0) || (bVar13 != 0xa1)) {
        if (bVar13 != 0x9f) {
          pRec = (sqlite3_value *)0x0;
          iVar4 = 0;
          goto LAB_00179eab;
        }
        pRec = valueNew(db,pCtx);
        iVar4 = 0;
        iVar5 = 0;
        if (pRec != (sqlite3_value *)0x0) {
          pRec->flags = 4;
          MVar8.i._1_7_ = 0;
          MVar8.i._0_1_ = (pExpr->u).zToken[4] == '\0';
          pRec->u = MVar8;
          goto LAB_00179eab;
        }
      }
      else {
        pEVar2 = (pExpr->x).pList;
        nArg = 0;
        if (pEVar2 != (ExprList *)0x0) {
          nArg = pEVar2->nExpr;
        }
        pFVar6 = sqlite3FindFunction(db,(pExpr->u).zToken,nArg,enc,'\0');
        iVar5 = 0;
        if ((char)((pFVar6->funcFlags & 0x20) >> 5) == '\0' && (pFVar6->funcFlags & 0x2800) != 0) {
          if (pEVar2 == (ExprList *)0x0) {
            p = (sqlite3_value **)0x0;
LAB_00179d9a:
            pRec_00 = valueNew(db,pCtx);
            if (pRec_00 != (sqlite3_value *)0x0) {
              local_68.argv[0] = (sqlite3_value *)0x0;
              local_68.iOp = 0;
              local_68.isError = 0;
              local_68.skipFlag = '\0';
              local_68.argc = '\0';
              local_68._42_6_ = 0;
              local_68.pMem = (Mem *)0x0;
              local_68.pVdbe = (Vdbe *)0x0;
              local_68.pOut = pRec_00;
              local_68.pFunc = pFVar6;
              (*pFVar6->xSFunc)(&local_68,nArg,p);
              iVar4 = local_68.isError;
              if (local_68.isError == 0) {
                applyAffinity(pRec_00,affinity,'\x01');
                iVar4 = sqlite3VdbeChangeEncoding(pRec_00,(uint)enc);
                if (iVar4 == 0) {
                  iVar4 = sqlite3VdbeMemTooBig(pRec_00);
                  if (iVar4 == 0) {
                    iVar4 = 0;
                  }
                  else {
                    piVar1 = &pCtx->pParse->nErr;
                    *piVar1 = *piVar1 + 1;
                    iVar4 = 0x12;
                  }
                }
              }
              else {
                pParse = pCtx->pParse;
                puVar7 = sqlite3_value_text(pRec_00);
                sqlite3ErrorMsg(pParse,"%s",puVar7);
              }
              pCtx->pParse->rc = iVar4;
              goto LAB_00179e73;
            }
            iVar4 = 7;
            pRec = (sqlite3_value *)0x0;
          }
          else {
            p = (sqlite3_value **)sqlite3DbMallocZero(db,(long)(int)nArg << 3);
            if (p == (sqlite3_value **)0x0) {
              iVar5 = 7;
              goto LAB_00179d8a;
            }
            uVar11 = 0;
            if (0 < (int)nArg) {
              uVar11 = (ulong)nArg;
            }
            lVar10 = 0;
            do {
              if (uVar11 * 8 == lVar10) goto LAB_00179d9a;
              iVar4 = sqlite3ValueFromExpr
                                (db,*(Expr **)((long)&pEVar2->a[0].pExpr + lVar10 * 4),enc,affinity,
                                 (sqlite3_value **)((long)p + lVar10));
            } while ((*(long *)((long)p + lVar10) != 0) && (lVar10 = lVar10 + 8, iVar4 == 0));
            pRec_00 = (sqlite3_value *)0x0;
LAB_00179e73:
            pRec = (sqlite3_value *)0x0;
            if (iVar4 == 0) {
              pRec = pRec_00;
            }
          }
          if (p != (sqlite3_value **)0x0) {
            uVar12 = 0;
            uVar11 = (ulong)nArg;
            if ((int)nArg < 1) {
              uVar11 = uVar12;
            }
            for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
              sqlite3ValueFree(p[uVar12]);
            }
            sqlite3DbFreeNN(db,p);
          }
          goto LAB_00179eab;
        }
      }
LAB_00179d8a:
      iVar4 = iVar5;
      pRec = (sqlite3_value *)0x0;
LAB_00179eab:
      *ppVal = pRec;
      return iVar4;
    }
    pRec = valueNew(db,pCtx);
    iVar4 = 0;
    if (pRec != (sqlite3_value *)0x0) {
      sqlite3VdbeMemNumerify(pRec);
      goto LAB_00179eab;
    }
  }
LAB_00179d00:
  pRec = (sqlite3_value *)0x0;
LAB_00179d03:
  if (pCtx == (ValueNewStat4Ctx *)0x0) {
    sqlite3OomFault(db);
    sqlite3ValueFree(pRec);
    return 7;
  }
  if (pCtx->pParse->nErr != 0) {
    return 7;
  }
  sqlite3OomFault(db);
  return 7;
}

Assistant:

static int valueFromExpr(
  sqlite3 *db,                    /* The database connection */
  Expr *pExpr,                    /* The expression to evaluate */
  u8 enc,                         /* Encoding to use */
  u8 affinity,                    /* Affinity to use */
  sqlite3_value **ppVal,          /* Write the new value here */
  struct ValueNewStat4Ctx *pCtx   /* Second argument for valueNew() */
){
  int op;
  char *zVal = 0;
  sqlite3_value *pVal = 0;
  int negInt = 1;
  const char *zNeg = "";
  int rc = SQLITE_OK;

  assert( pExpr!=0 );
  while( (op = pExpr->op)==TK_UPLUS || op==TK_SPAN ) pExpr = pExpr->pLeft;
#if defined(SQLITE_ENABLE_STAT3_OR_STAT4)
  if( op==TK_REGISTER ) op = pExpr->op2;
#else
  if( NEVER(op==TK_REGISTER) ) op = pExpr->op2;
#endif

  /* Compressed expressions only appear when parsing the DEFAULT clause
  ** on a table column definition, and hence only when pCtx==0.  This
  ** check ensures that an EP_TokenOnly expression is never passed down
  ** into valueFromFunction(). */
  assert( (pExpr->flags & EP_TokenOnly)==0 || pCtx==0 );

  if( op==TK_CAST ){
    u8 aff = sqlite3AffinityType(pExpr->u.zToken,0);
    rc = valueFromExpr(db, pExpr->pLeft, enc, aff, ppVal, pCtx);
    testcase( rc!=SQLITE_OK );
    if( *ppVal ){
      sqlite3VdbeMemCast(*ppVal, aff, SQLITE_UTF8);
      sqlite3ValueApplyAffinity(*ppVal, affinity, SQLITE_UTF8);
    }
    return rc;
  }

  /* Handle negative integers in a single step.  This is needed in the
  ** case when the value is -9223372036854775808.
  */
  if( op==TK_UMINUS
   && (pExpr->pLeft->op==TK_INTEGER || pExpr->pLeft->op==TK_FLOAT) ){
    pExpr = pExpr->pLeft;
    op = pExpr->op;
    negInt = -1;
    zNeg = "-";
  }

  if( op==TK_STRING || op==TK_FLOAT || op==TK_INTEGER ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    if( ExprHasProperty(pExpr, EP_IntValue) ){
      sqlite3VdbeMemSetInt64(pVal, (i64)pExpr->u.iValue*negInt);
    }else{
      zVal = sqlite3MPrintf(db, "%s%s", zNeg, pExpr->u.zToken);
      if( zVal==0 ) goto no_mem;
      sqlite3ValueSetStr(pVal, -1, zVal, SQLITE_UTF8, SQLITE_DYNAMIC);
    }
    if( (op==TK_INTEGER || op==TK_FLOAT ) && affinity==SQLITE_AFF_BLOB ){
      sqlite3ValueApplyAffinity(pVal, SQLITE_AFF_NUMERIC, SQLITE_UTF8);
    }else{
      sqlite3ValueApplyAffinity(pVal, affinity, SQLITE_UTF8);
    }
    if( pVal->flags & (MEM_Int|MEM_Real) ) pVal->flags &= ~MEM_Str;
    if( enc!=SQLITE_UTF8 ){
      rc = sqlite3VdbeChangeEncoding(pVal, enc);
    }
  }else if( op==TK_UMINUS ) {
    /* This branch happens for multiple negative signs.  Ex: -(-5) */
    if( SQLITE_OK==valueFromExpr(db,pExpr->pLeft,enc,affinity,&pVal,pCtx) 
     && pVal!=0
    ){
      sqlite3VdbeMemNumerify(pVal);
      if( pVal->flags & MEM_Real ){
        pVal->u.r = -pVal->u.r;
      }else if( pVal->u.i==SMALLEST_INT64 ){
        pVal->u.r = -(double)SMALLEST_INT64;
        MemSetTypeFlag(pVal, MEM_Real);
      }else{
        pVal->u.i = -pVal->u.i;
      }
      sqlite3ValueApplyAffinity(pVal, affinity, enc);
    }
  }else if( op==TK_NULL ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    sqlite3VdbeMemNumerify(pVal);
  }
#ifndef SQLITE_OMIT_BLOB_LITERAL
  else if( op==TK_BLOB ){
    int nVal;
    assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
    assert( pExpr->u.zToken[1]=='\'' );
    pVal = valueNew(db, pCtx);
    if( !pVal ) goto no_mem;
    zVal = &pExpr->u.zToken[2];
    nVal = sqlite3Strlen30(zVal)-1;
    assert( zVal[nVal]=='\'' );
    sqlite3VdbeMemSetStr(pVal, sqlite3HexToBlob(db, zVal, nVal), nVal/2,
                         0, SQLITE_DYNAMIC);
  }
#endif
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  else if( op==TK_FUNCTION && pCtx!=0 ){
    rc = valueFromFunction(db, pExpr, enc, affinity, &pVal, pCtx);
  }
#endif
  else if( op==TK_TRUEFALSE ){
    pVal = valueNew(db, pCtx);
    if( pVal ){
      pVal->flags = MEM_Int;
      pVal->u.i = pExpr->u.zToken[4]==0;
    }
  }

  *ppVal = pVal;
  return rc;

no_mem:
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx==0 || pCtx->pParse->nErr==0 )
#endif
    sqlite3OomFault(db);
  sqlite3DbFree(db, zVal);
  assert( *ppVal==0 );
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx==0 ) sqlite3ValueFree(pVal);
#else
  assert( pCtx==0 ); sqlite3ValueFree(pVal);
#endif
  return SQLITE_NOMEM_BKPT;
}